

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fnv.cpp
# Opt level: O1

void __thiscall Fnv_StandardVectors_Test::TestBody(Fnv_StandardVectors_Test *this)

{
  long lVar1;
  long lVar2;
  pointer *__ptr;
  undefined1 *puVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  uint64_t hval;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  internal local_50;
  undefined7 uStack_4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  ulong local_38;
  
  puVar3 = (anonymous_namespace)::fnv_test_str;
  pcVar4 = anon_var_dwarf_d47bc + 0x50;
  lVar2 = 1;
  do {
    pstore::gsl::details::extent_type<-1L>::extent_type
              ((extent_type<_1L> *)&local_50,*(index_type *)(puVar3 + 8));
    local_38 = 0xcbf29ce484222325;
    if (CONCAT71(uStack_4f,local_50) != 0) {
      lVar1 = 0;
      local_38 = 0xcbf29ce484222325;
      do {
        local_38 = ((byte)pcVar4[lVar1] ^ local_38) * 0x100000001b3;
        lVar1 = lVar1 + 1;
      } while (CONCAT71(uStack_4f,local_50) != lVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (&local_50,"hval","fnv1a_64_vector[test_num - 1].fnv1a_64",&local_38,
               (unsigned_long *)((anonymous_namespace)::fnv_test_str + lVar2 * 0x10 + 0xcb8));
    if (local_50 == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_58._M_head_impl + 0x10),"failed test # ",0xe);
      std::ostream::operator<<((ostream *)(local_58._M_head_impl + 0x10),(int)lVar2);
      pcVar4 = anon_var_dwarf_d47bc + 0x50;
      if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_48->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_fnv.cpp"
                 ,0x220,pcVar4);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
    lVar2 = lVar2 + 1;
    pcVar4 = *(char **)(puVar3 + 0x10);
    puVar3 = puVar3 + 0x10;
  } while (pcVar4 != (char *)0x0);
  return;
}

Assistant:

TEST (Fnv, StandardVectors) {
    auto test_num = 1; // test vector that failed, starting at 1.
    for (test_vector const * t = fnv_test_str; t->buf != nullptr; ++t, ++test_num) {
        auto const * const first = reinterpret_cast<std::uint8_t const *> (t->buf);
        std::uint64_t const hval = pstore::fnv_64a_buf (
            pstore::gsl::make_span (first, first + t->len));
        EXPECT_EQ (hval, fnv1a_64_vector[test_num - 1].fnv1a_64) << "failed test # " << test_num;
    }
}